

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

symbol ** Symbol_arrayof(void)

{
  int iVar1;
  int local_1c;
  int size;
  int i;
  symbol **array;
  
  if (x2a == (s_x2 *)0x0) {
    array = (symbol **)0x0;
  }
  else {
    iVar1 = x2a->count;
    array = (symbol **)calloc((long)iVar1,8);
    if (array != (symbol **)0x0) {
      for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
        array[local_1c] = x2a->tbl[local_1c].data;
      }
    }
  }
  return array;
}

Assistant:

struct symbol **Symbol_arrayof()
{
  struct symbol **array;
  int i,size;
  if( x2a==0 ) return 0;
  size = x2a->count;
  array = (struct symbol **)calloc(size, sizeof(struct symbol *));
  if( array ){
    for(i=0; i<size; i++) array[i] = x2a->tbl[i].data;
  }
  return array;
}